

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> __thiscall
ELFIO::elfio::create_header(elfio *this,uchar file_class,uchar encoding)

{
  elfio *peVar1;
  undefined1 in_CL;
  undefined2 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long lVar5;
  undefined2 uVar6;
  bool bVar7;
  
  lVar5 = CONCAT71(in_register_00000031,file_class);
  iVar4 = (int)CONCAT71(in_register_00000011,encoding);
  if (iVar4 == 1) {
    peVar1 = (elfio *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    if (peVar1 != (elfio *)0x0) {
      (peVar1->sections).parent = (elfio *)&PTR__elf_header_00120cf8;
      (peVar1->segments).parent = (elfio *)0x0;
      (peVar1->pstream)._M_t.
      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
      (peVar1->header)._M_t.
      super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
      super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
      super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)0x0;
      (peVar1->sections_).
      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (peVar1->sections_).
      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (peVar1->sections_).
      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined4 *)
       &(peVar1->segments_).
        super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 0;
      (peVar1->segments_).
      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar5 + 0x50);
      (peVar1->segments_).
      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar5 + 0x58);
      *(undefined4 *)&(peVar1->segments).parent = 0x464c457f;
      *(undefined1 *)((long)&(peVar1->segments).parent + 4) = 1;
      *(undefined1 *)((long)&(peVar1->segments).parent + 5) = in_CL;
      *(undefined1 *)((long)&(peVar1->segments).parent + 6) = 1;
      bVar7 = *(char *)(lVar5 + 0x50) != '\0';
      uVar3 = 0x1000000;
      if (!bVar7) {
        uVar3 = 1;
      }
      uVar6 = 0x34;
      if (bVar7) {
        uVar6 = 0x3400;
      }
      *(undefined4 *)
       ((long)&(peVar1->header)._M_t.
               super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
               _M_t.
               super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
               super__Head_base<0UL,_ELFIO::elf_header_*,_false> + 4) = uVar3;
      uVar2 = 0x100;
      if (!bVar7) {
        uVar2 = 1;
      }
      *(undefined2 *)
       &(peVar1->sections_).
        super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = uVar6;
      *(undefined2 *)
       ((long)&(peVar1->segments_).
               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2) = uVar2;
      uVar6 = 0x20;
      if (bVar7) {
        uVar6 = 0x2000;
      }
      *(undefined2 *)
       ((long)&(peVar1->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = uVar6;
      uVar6 = 0x28;
      if (bVar7) {
        uVar6 = 0x2800;
      }
      *(undefined2 *)
       ((long)&(peVar1->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) = uVar6;
      goto LAB_0010cf08;
    }
  }
  else if (iVar4 == 2) {
    peVar1 = (elfio *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    if (peVar1 != (elfio *)0x0) {
      (peVar1->sections).parent = (elfio *)&PTR__elf_header_00120bb0;
      (peVar1->segments).parent = (elfio *)0x0;
      (peVar1->pstream)._M_t.
      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
      (peVar1->header)._M_t.
      super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
      super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
      super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)0x0;
      (peVar1->sections_).
      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (peVar1->sections_).
      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (peVar1->sections_).
      super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (peVar1->segments_).
      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (peVar1->segments_).
      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (peVar1->segments_).
      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar5 + 0x50);
      *(long *)&peVar1->convertor = lVar5 + 0x58;
      *(undefined4 *)&(peVar1->segments).parent = 0x464c457f;
      *(undefined1 *)((long)&(peVar1->segments).parent + 4) = 2;
      *(undefined1 *)((long)&(peVar1->segments).parent + 5) = in_CL;
      *(undefined1 *)((long)&(peVar1->segments).parent + 6) = 1;
      bVar7 = *(char *)(lVar5 + 0x50) != '\0';
      uVar3 = 0x1000000;
      if (!bVar7) {
        uVar3 = 1;
      }
      uVar6 = 0x40;
      if (bVar7) {
        uVar6 = 0x4000;
      }
      *(undefined4 *)
       ((long)&(peVar1->header)._M_t.
               super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
               _M_t.
               super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
               super__Head_base<0UL,_ELFIO::elf_header_*,_false> + 4) = uVar3;
      uVar2 = 0x100;
      if (!bVar7) {
        uVar2 = 1;
      }
      *(undefined2 *)
       ((long)&(peVar1->segments_).
               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4) = uVar6;
      *(undefined2 *)
       ((long)&(peVar1->segments_).
               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 6) = uVar2;
      uVar2 = 0x38;
      if (bVar7) {
        uVar2 = 0x3800;
      }
      *(undefined2 *)
       ((long)&(peVar1->segments_).
               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 6) = uVar2;
      *(undefined2 *)
       ((long)&(peVar1->segments_).
               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 2) = uVar6;
      goto LAB_0010cf08;
    }
  }
  else {
    (this->sections).parent = (elfio *)0x0;
  }
  peVar1 = (elfio *)0x0;
LAB_0010cf08:
  (this->sections).parent = peVar1;
  return (__uniq_ptr_data<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>,_true,_true>)
         (__uniq_ptr_data<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<elf_header> create_header( unsigned char file_class,
                                               unsigned char encoding )
    {
        std::unique_ptr<elf_header> new_header;

        if ( file_class == ELFCLASS64 ) {
            new_header = std::unique_ptr<elf_header>(
                new ( std::nothrow ) elf_header_impl<Elf64_Ehdr>(
                    &convertor, encoding, &addr_translator ) );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_header = std::unique_ptr<elf_header>(
                new ( std::nothrow ) elf_header_impl<Elf32_Ehdr>(
                    &convertor, encoding, &addr_translator ) );
        }
        else {
            return nullptr;
        }

        return new_header;
    }